

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::f_slash(Forth *this)

{
  ForthStack<double> *this_00;
  double dVar1;
  double dVar2;
  
  requireFStackDepth(this,2,"F/");
  this_00 = &this->fStack;
  dVar1 = ForthStack<double>::getTop(this_00);
  ForthStack<double>::pop(this_00);
  dVar2 = ForthStack<double>::getTop(this_00);
  ForthStack<double>::setTop(this_00,dVar2 / dVar1);
  return;
}

Assistant:

void f_slash() {
			REQUIRE_FSTACK_DEPTH(2, "F/");
			auto n2 = static_cast<FCell>(fStack.getTop()); fStack.pop();
			auto n1 = static_cast<FCell>(fStack.getTop());
			// division by 0 must return actual Nan +Inf or -Inf
			// RUNTIME_ERROR_IF(n2 == 0., "/: zero divisor", errorDivisionByZero);
			fStack.setTop(static_cast<FCell>(n1 / n2));
		}